

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O2

void __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
::
query_impl<perior::query::query_intersects_box<perior::point<double,2ul>>,std::back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>>
          (rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
           *this,size_t node_idx,query_intersects_box<perior::point<double,_2UL>_> *q,
          back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>_>
          out)

{
  stored_size_type sVar1;
  size_type n;
  vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
  *pvVar2;
  type_conflict tVar3;
  const_reference prVar4;
  reference puVar5;
  const_reference __x;
  const_iterator i;
  vec_iterator<unsigned_long_*,_true> local_78;
  back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>_>
  local_70;
  point_type *local_68;
  rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
  *local_60;
  query_intersects_box<perior::point<double,_2UL>_> local_58;
  
  local_60 = this + 0x50;
  local_70.container = out.container;
  prVar4 = boost::container::
           vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
           ::at((vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
                 *)local_60,node_idx);
  local_78.m_ptr = (unsigned_long *)&prVar4->entry;
  if (prVar4->is_leaf == true) {
    sVar1 = (prVar4->entry).
            super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
            .m_holder.m_size;
    pvVar2 = &((container_type *)local_78.m_ptr)->
              super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    ;
    while (local_78.m_ptr !=
           (unsigned_long *)
           ((long)&(pvVar2->m_holder).super_static_storage_allocator<unsigned_long,_6UL,_0UL,_true>.
                   storage + sVar1 * 8)) {
      puVar5 = boost::container::vec_iterator<unsigned_long_*,_true>::operator*(&local_78);
      __x = boost::container::
            vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_void>
            ::at((vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_void>
                  *)(this + 0x68),*puVar5);
      tVar3 = intersects<perior::point<double,2ul>,perior::cubic_periodic_boundary>
                        (&__x->first,&q->rect,
                         (cubic_periodic_boundary<perior::point<double,_2UL>_> *)(this + 0x10));
      if (tVar3) {
        std::
        vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
        ::push_back(local_70.container,__x);
      }
      boost::container::vec_iterator<unsigned_long_*,_true>::operator++(&local_78);
    }
  }
  else {
    sVar1 = (prVar4->entry).
            super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
            .m_holder.m_size;
    pvVar2 = &((container_type *)local_78.m_ptr)->
              super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    ;
    local_68 = &(q->rect).radius;
    while (local_78.m_ptr !=
           (unsigned_long *)
           ((long)&(pvVar2->m_holder).super_static_storage_allocator<unsigned_long,_6UL,_0UL,_true>.
                   storage + sVar1 * 8)) {
      puVar5 = boost::container::vec_iterator<unsigned_long_*,_true>::operator*(&local_78);
      n = *puVar5;
      prVar4 = boost::container::
               vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
               ::at((vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
                     *)local_60,n);
      tVar3 = intersects<perior::point<double,2ul>,perior::cubic_periodic_boundary>
                        (&q->rect,&prVar4->box,
                         (cubic_periodic_boundary<perior::point<double,_2UL>_> *)(this + 0x10));
      if (tVar3) {
        local_58.rect.center.values_.elems[0] = (q->rect).center.values_.elems[0];
        local_58.rect.center.values_.elems[1] = (q->rect).center.values_.elems[1];
        local_58.rect.radius.values_.elems[0] = (local_68->values_).elems[0];
        local_58.rect.radius.values_.elems[1] = (local_68->values_).elems[1];
        query_impl<perior::query::query_intersects_box<perior::point<double,2ul>>,std::back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>>
                  (this,n,&local_58,local_70);
      }
      boost::container::vec_iterator<unsigned_long_*,_true>::operator++(&local_78);
    }
  }
  return;
}

Assistant:

void query_impl(std::size_t node_idx, Query q, OutputIterator out) const
    {
        const node_type& node = tree_.at(node_idx);
        if(node.is_leaf)
        {
            for(typename node_type::const_iterator
                i(node.entry.begin()), e(node.entry.end()); i != e; ++i)
            {
                value_type const& val = container_.at(*i);
                if(q.match(indexable_getter_(val), this->boundary_) && q.match(val))
                {
                    *out = val;
                    ++out;
                }
            }
        }
        else
        {
            for(typename node_type::const_iterator
                i(node.entry.begin()), e(node.entry.end()); i != e; ++i)
            {
                const std::size_t next = *i;
                if(intersects(q.box(), tree_.at(next).box, this->boundary_))
                {
                    this->query_impl(next, q, out);
                }
            }
        }
        return;
    }